

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O1

void __thiscall
DScroller::DScroller
          (DScroller *this,EScroll type,double dx,double dy,int control,int affectee,int accel,
          EScrollPos scrollpos)

{
  TObjPtr<DInterpolation> *pTVar1;
  double dVar2;
  double dVar3;
  side_t *psVar4;
  TObjPtr<DInterpolation> TVar5;
  DInterpolation *pDVar6;
  
  DThinker::DThinker(&this->super_DThinker,0x20);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00700be0;
  pTVar1 = this->m_Interpolations;
  this->m_Type = type;
  this->m_dx = dx;
  this->m_dy = dy;
  this->m_Accel = accel;
  this->m_Parts = scrollpos;
  this->m_LastHeight = 0.0;
  this->m_vdx = 0.0;
  this->m_vdy = 0.0;
  this->m_Control = control;
  if (control != -1) {
    dVar2 = sectors[control].centerspot.X;
    dVar3 = sectors[control].centerspot.Y;
    this->m_LastHeight =
         (dVar3 * sectors[control].ceilingplane.normal.Y +
         dVar2 * sectors[control].ceilingplane.normal.X + sectors[control].ceilingplane.D) *
         sectors[control].ceilingplane.negiC +
         (sectors[control].floorplane.normal.Y * dVar3 +
         sectors[control].floorplane.normal.X * dVar2 + sectors[control].floorplane.D) *
         sectors[control].floorplane.negiC;
  }
  this->m_Affectee = affectee;
  (pTVar1->field_0).p = (DInterpolation *)0x0;
  this->m_Interpolations[1].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)0x0;
  this->m_Interpolations[2].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)0x0;
  psVar4 = sides;
  switch(type) {
  case sc_side:
    sides[affectee].Flags = sides[affectee].Flags | 2;
    if ((scrollpos & scw_top) != 0) {
      pDVar6 = side_t::SetInterpolation(psVar4 + affectee,0);
      (pTVar1->field_0).p = pDVar6;
    }
    if ((this->m_Parts & scw_mid) != 0) {
      if (((sides[this->m_Affectee].linedef)->backsector == (sector_t_conflict *)0x0) ||
         (((sides[this->m_Affectee].linedef)->flags & 0x200000) == 0)) {
        TVar5.field_0 =
             (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)
             side_t::SetInterpolation(sides + this->m_Affectee,1);
        this->m_Interpolations[1].field_0 = TVar5.field_0;
      }
    }
    if ((this->m_Parts & scw_bottom) != 0) {
      TVar5.field_0 =
           (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)
           side_t::SetInterpolation(sides + this->m_Affectee,2);
      this->m_Interpolations[2].field_0 = TVar5.field_0;
    }
    break;
  case sc_floor:
    pDVar6 = sector_t::SetInterpolation((sector_t *)(sectors + affectee),3,false);
    goto LAB_00441b6b;
  case sc_ceiling:
    pDVar6 = sector_t::SetInterpolation((sector_t *)(sectors + affectee),2,false);
LAB_00441b6b:
    (pTVar1->field_0).p = pDVar6;
    break;
  case sc_carry:
    FLevelLocals::AddScroller(&level,affectee);
  }
  return;
}

Assistant:

DScroller::DScroller (EScroll type, double dx, double dy,
					  int control, int affectee, int accel, EScrollPos scrollpos)
	: DThinker (STAT_SCROLLER)
{
	m_Type = type;
	m_dx = dx;
	m_dy = dy;
	m_Accel = accel;
	m_Parts = scrollpos;
	m_vdx = m_vdy = 0;
	m_LastHeight = 0;
	if ((m_Control = control) != -1)
		m_LastHeight =
			sectors[control].CenterFloor () + sectors[control].CenterCeiling ();
	m_Affectee = affectee;
	m_Interpolations[0] = m_Interpolations[1] = m_Interpolations[2] = NULL;

	switch (type)
	{
	case EScroll::sc_carry:
		level.AddScroller (affectee);
		break;

	case EScroll::sc_side:
		sides[affectee].Flags |= WALLF_NOAUTODECALS;
		if (m_Parts & EScrollPos::scw_top)
		{
			m_Interpolations[0] = sides[m_Affectee].SetInterpolation(side_t::top);
		}
		if (m_Parts & EScrollPos::scw_mid && (sides[m_Affectee].linedef->backsector == NULL ||
			!(sides[m_Affectee].linedef->flags&ML_3DMIDTEX)))
		{
			m_Interpolations[1] = sides[m_Affectee].SetInterpolation(side_t::mid);
		}
		if (m_Parts & EScrollPos::scw_bottom)
		{
			m_Interpolations[2] = sides[m_Affectee].SetInterpolation(side_t::bottom);
		}
		break;

	case EScroll::sc_floor:
		m_Interpolations[0] = sectors[affectee].SetInterpolation(sector_t::FloorScroll, false);
		break;

	case EScroll::sc_ceiling:
		m_Interpolations[0] = sectors[affectee].SetInterpolation(sector_t::CeilingScroll, false);
		break;

	default:
		break;
	}
}